

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

string * __thiscall
banksia::ChessBoard::getFen_abi_cxx11_(ChessBoard *this,int halfCount,int fullMoveCount)

{
  bool bVar1;
  ostream *poVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  Piece piece;
  int i;
  int e;
  ostringstream stringStream;
  BoardCore *in_stack_fffffffffffffdc8;
  char *local_220;
  string local_1f0 [32];
  string local_1d0 [48];
  Piece local_1a0;
  int local_198;
  int local_194;
  ostringstream local_190 [268];
  int in_stack_ffffffffffffff7c;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = 0;
  for (local_198 = 0; local_198 < 0x40; local_198 = local_198 + 1) {
    local_1a0 = BoardCore::getPiece(in_stack_fffffffffffffdc8,0);
    bVar1 = Piece::isEmpty(&local_1a0);
    if (bVar1) {
      local_194 = local_194 + 1;
    }
    else {
      if (local_194 != 0) {
        std::ostream::operator<<(local_190,local_194);
        local_194 = 0;
      }
      Piece::toString_abi_cxx11_((Piece *)in_stack_fffffffffffffdc8);
      std::operator<<((ostream *)local_190,local_1d0);
      std::__cxx11::string::~string(local_1d0);
    }
    if (local_198 % 8 == 7) {
      if (local_194 != 0) {
        std::ostream::operator<<(local_190,local_194);
      }
      if (local_198 < 0x3f) {
        std::operator<<((ostream *)local_190,"/");
      }
      local_194 = 0;
    }
  }
  if (*(int *)(in_RSI + 0x20) == 1) {
    local_220 = " w ";
  }
  else {
    local_220 = " b ";
  }
  std::operator<<((ostream *)local_190,local_220);
  if ((int)*(char *)(in_RSI + 0xb5) + (int)*(char *)(in_RSI + 0xb4) == 0) {
    std::operator<<((ostream *)local_190,"-");
  }
  else {
    if (((int)*(char *)(in_RSI + 0xb5) & *(uint *)(in_RSI + 0xa4)) != 0) {
      std::operator<<((ostream *)local_190,"K");
    }
    if (((int)*(char *)(in_RSI + 0xb5) & *(uint *)(in_RSI + 0xa0)) != 0) {
      std::operator<<((ostream *)local_190,"Q");
    }
    if (((int)*(char *)(in_RSI + 0xb4) & *(uint *)(in_RSI + 0xa4)) != 0) {
      std::operator<<((ostream *)local_190,"k");
    }
    if (((int)*(char *)(in_RSI + 0xb4) & *(uint *)(in_RSI + 0xa0)) != 0) {
      std::operator<<((ostream *)local_190,"q");
    }
  }
  std::operator<<((ostream *)local_190," ");
  if (*(int *)(in_RSI + 0xb0) < 1) {
    std::operator<<((ostream *)local_190,"-");
  }
  else {
    posToCoordinateString_abi_cxx11_(in_stack_ffffffffffffff7c);
    std::operator<<((ostream *)local_190,local_1f0);
    std::__cxx11::string::~string(local_1f0);
  }
  poVar2 = std::operator<<((ostream *)local_190," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,in_ECX);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string ChessBoard::getFen(int halfCount, int fullMoveCount) const {
    std::ostringstream stringStream;
    
    int e = 0;
    for (int i=0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            e += 1;
        } else {
            if (e) {
                stringStream << e;
                e = 0;
            }
            stringStream << piece.toString();
        }
        
        if (i % 8 == 7) {
            if (e) {
                stringStream << e;
            }
            if (i < 63) {
                stringStream << "/";
            }
            e = 0;
        }
    }
    
    stringStream << (side == Side::white ? " w " : " b ");
    
    if (castleRights[W] + castleRights[B]) {
        if (castleRights[W] & CastleRight_short) {
            stringStream << "K";
        }
        if (castleRights[W] & CastleRight_long) {
            stringStream << "Q";
        }
        if (castleRights[B] & CastleRight_short) {
            stringStream << "k";
        }
        if (castleRights[B] & CastleRight_long) {
            stringStream << "q";
        }
    } else {
        stringStream << "-";
    }
    
    stringStream << " ";
    if (enpassant > 0) {
        stringStream << posToCoordinateString(enpassant);
    } else {
        stringStream << "-";
    }
    
    stringStream << " " << halfCount << " " << fullMoveCount;
    
    return stringStream.str();
}